

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void INT_EVclient_ready_for_shutdown(EVclient client)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long *in_RDI;
  CMTraceType in_stack_0000000c;
  CManager in_stack_00000010;
  EVshutdown_contribution_msg msg;
  CMFormat shutdown_msg;
  timespec ts;
  CMConnection in_stack_00000220;
  int in_stack_0000022c;
  EVmaster in_stack_00000230;
  FILE *in_stack_ffffffffffffffc8;
  CMConnection in_stack_ffffffffffffffd0;
  timespec local_18;
  long *local_8;
  
  if ((int)in_RDI[8] != 0) {
    return;
  }
  local_8 = in_RDI;
  if (*(long *)(*in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_00000010,in_stack_0000000c);
    if (iVar1 == 0) goto LAB_00160e75;
  }
  else if (CMtrace_val[0xd] == 0) goto LAB_00160e75;
  if (CMtrace_PID != 0) {
    in_stack_ffffffffffffffc8 = *(FILE **)(*local_8 + 0x120);
    _Var2 = getpid();
    in_stack_ffffffffffffffd0 = (CMConnection)(long)_Var2;
    pVar3 = pthread_self();
    fprintf(in_stack_ffffffffffffffc8,"P%lxT%lx - ",in_stack_ffffffffffffffd0,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_18);
    fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_18.tv_sec,local_18.tv_nsec);
  }
  fprintf(*(FILE **)(*local_8 + 0x120),"Client %d ready for shutdown \n",
          (ulong)*(uint *)(local_8 + 6));
LAB_00160e75:
  fflush(*(FILE **)(*local_8 + 0x120));
  if (local_8[4] == 0) {
    possibly_signal_shutdown(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
  }
  else {
    INT_CMlookup_format((CManager)*local_8,EVclient_shutdown_contribution_format_list);
    INT_CMwrite(in_stack_ffffffffffffffd0,(CMFormat)in_stack_ffffffffffffffc8,(void *)0x160ece);
  }
  return;
}

Assistant:

extern void
INT_EVclient_ready_for_shutdown(EVclient client)
{
    if (client->already_shutdown) return;
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d ready for shutdown \n", client->my_node_id);
    if (client->master_connection != NULL) {
	/* we are a client, tell the master to shutdown */
	CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
	EVshutdown_contribution_msg msg;
	msg.value = STATUS_NO_CONTRIBUTION;   /* no status contribution */
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
    } else {
	possibly_signal_shutdown(client->master, STATUS_NO_CONTRIBUTION, NULL);
    }
}